

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::TaggedUnionExpression>
          (StaticInitializerVisitor *this,TaggedUnionExpression *expr)

{
  ExpressionKind EVar1;
  SymbolKind SVar2;
  SystemSubroutine *pSVar3;
  optional<bool> oVar4;
  int iVar5;
  Symbol *pSVar6;
  Expression *pEVar7;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar8;
  Diagnostic *this_00;
  Diagnostic *this_01;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar9;
  SourceLocation SVar10;
  DiagCode code;
  ASTContext *this_02;
  size_t i_1;
  Expression *pEVar12;
  size_t i;
  bool bVar13;
  ArgList AVar14;
  SourceRange sourceRange;
  SourceLocation SVar11;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 - NamedValue < 2) {
    pSVar6 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (pSVar6 != (Symbol *)0x0) {
      SVar2 = pSVar6->kind;
      if ((SVar2 == ModportPort) || (SVar2 == Net)) {
        this_02 = this->context;
        SVar11 = (expr->super_Expression).sourceRange.startLoc;
        SVar10 = (expr->super_Expression).sourceRange.endLoc;
        code.subsystem = Declarations;
        code.code = 0xf8;
LAB_00267706:
        sourceRange.endLoc = SVar10;
        sourceRange.startLoc = SVar11;
        this_00 = ASTContext::addDiag(this_02,code,sourceRange);
        this_01 = Diagnostic::operator<<(this_00,this->sourceVar->name);
        Diagnostic::operator<<(this_01,pSVar6->name);
        Diagnostic::addNote(this_00,(DiagCode)0x50001,pSVar6->location);
        return;
      }
      if ((SVar2 == Variable) && (pSVar6 != this->sourceVar)) {
        pEVar7 = DeclaredType::getInitializer((DeclaredType *)(pSVar6 + 1));
        bVar13 = pSVar6[5].name._M_len != 0;
        oVar4 = Symbol::isDeclaredBefore(pSVar6,this->sourceVar);
        if ((bVar13 || pEVar7 == (Expression *)0x0) ||
           ((((ushort)oVar4.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0 ||
            (((ushort)oVar4.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 1) == 0)))) {
          code = (DiagCode)((uint)(bVar13 || pEVar7 == (Expression *)0x0) * 0x10000 + 0xf70006);
          this_02 = this->context;
          SVar11 = (expr->super_Expression).sourceRange.startLoc;
          SVar10 = (expr->super_Expression).sourceRange.endLoc;
          goto LAB_00267706;
        }
      }
    }
  }
  else if (EVar1 == Call) {
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)expr,this);
    if (*(char *)&expr[1].super_Expression.sourceRange.startLoc == '\x01') {
      pvVar8 = std::
               get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                           *)&expr->member);
      pSVar3 = (pvVar8->subroutine).ptr;
      pSVar6 = expr[1].member;
      pEVar7 = expr[1].valueExpr;
      for (pEVar12 = (Expression *)0x0; pEVar7 != pEVar12;
          pEVar12 = (Expression *)((long)&pEVar12->kind + 1)) {
        iVar5 = (*pSVar3->_vptr_SystemSubroutine[4])(pSVar3,pEVar12);
        if ((char)iVar5 == '\0') {
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    (*(Expression **)(&pSVar6->kind + (long)pEVar12 * 2),this);
        }
      }
    }
    else {
      ppSVar9 = std::
                get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)&expr->member);
      AVar14 = SubroutineSymbol::getArguments(*ppSVar9);
      pSVar6 = expr[1].member;
      pEVar7 = expr[1].valueExpr;
      for (pEVar12 = (Expression *)0x0; pEVar7 != pEVar12;
          pEVar12 = (Expression *)((long)&pEVar12->kind + 1)) {
        if (AVar14._M_ptr[(long)pEVar12]->direction == In) {
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    (*(Expression **)(&pSVar6->kind + (long)pEVar12 * 2),this);
        }
      }
    }
  }
  else if (EVar1 != NewCovergroup) {
    TaggedUnionExpression::visitExprs<slang::ast::StaticInitializerVisitor&>(expr,this);
    return;
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }